

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomWalkUtils.h
# Opt level: O0

OrderedEdgeCollection *
GetEdgesByRandomWalk
          (OrderedEdgeCollection *__return_storage_ptr__,CGraph *cg,long params,byte param_4)

{
  size_type sVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  reference pvVar5;
  long lVar6;
  EdgeIdx *pEVar7;
  EdgeIdx *pEVar8;
  byte bVar9;
  reference rVar10;
  EdgeIdx aEStack_2968 [625];
  vector<bool,_std::allocator<bool>_> *local_15e0;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> *local_15d8;
  _Bit_type local_15d0;
  _Bit_type *local_15c8;
  _Bit_type local_15c0;
  _Bit_type *local_15b8;
  EdgeIdx local_15b0;
  long local_15a8;
  result_type local_15a0;
  EdgeIdx local_1598;
  EdgeIdx *local_1590;
  CGraph *local_1588;
  VertexIdx local_1580;
  EdgeIdx local_1578;
  size_type local_1570;
  allocator_type *local_1568;
  long local_1560;
  OrderedEdgeCollection *local_1558;
  OrderedEdgeCollection *local_1550;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_1548;
  size_type local_1540;
  allocator_type *local_1538;
  undefined1 local_1529;
  _Bit_reference local_1528;
  _Bit_reference local_1518;
  value_type local_1508;
  value_type local_14e8;
  EdgeIdx local_14c8;
  VertexIdx low_deg;
  VertexIdx v;
  VertexIdx u;
  EdgeIdx random_nbor_edge;
  uniform_int_distribution<long> dist_parent_nbor;
  EdgeIdx wL;
  VertexIdx local_108;
  VertexIdx seed;
  VertexIdx sC;
  VertexIdx deg_of_child;
  VertexIdx deg_of_parent;
  VertexIdx child;
  VertexIdx parent;
  VertexIdx no_of_query;
  undefined1 local_c8 [8];
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  allocator<bool> local_8a;
  bool local_89;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  EdgeIdx walk_length;
  VertexIdx seed_count;
  EdgeIdx m;
  VertexIdx n;
  bool is_degree_orered_local;
  Parameters *params_local;
  CGraph *cg_local;
  OrderedEdgeCollection *returnEdgeCollection;
  
  bVar9 = 0;
  local_1548 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&stack0x00000008;
  sVar1 = cg->nVertices;
  sVar2 = cg->nEdges;
  lVar3 = *(long *)(params + 0x20);
  lVar4 = *(long *)(params + 0x40);
  local_1560 = params;
  local_1558 = __return_storage_ptr__;
  local_1550 = __return_storage_ptr__;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  local_89 = false;
  local_1538 = &local_8a;
  local_1540 = sVar2;
  std::allocator<bool>::allocator(local_1538);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,local_1540,&local_89,local_1538);
  std::allocator<bool>::~allocator(&local_8a);
  no_of_query._7_1_ = 0;
  local_1568 = (allocator_type *)((long)&no_of_query + 6);
  local_1570 = sVar1;
  std::allocator<bool>::allocator(local_1568);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c8,local_1570,
             (bool *)((long)&no_of_query + 7),local_1568);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&no_of_query + 6));
  parent = 0;
  for (seed = 0; seed < lVar3; seed = seed + 1) {
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(local_1560 + 0x28),seed);
    local_108 = *pvVar5;
    child = local_108;
    local_1578 = Escape::CGraph::degree(cg,local_108);
    deg_of_child = local_1578;
    if (local_1578 == 0) {
      local_1590 = &wL;
      local_1588 = cg;
      memcpy(local_1590,local_1548,5000);
      pEVar7 = local_1590;
      pEVar8 = aEStack_2968;
      for (lVar6 = 0x271; lVar6 != 0; lVar6 = lVar6 + -1) {
        *pEVar8 = *pEVar7;
        pEVar7 = pEVar7 + (ulong)bVar9 * -2 + 1;
        pEVar8 = pEVar8 + (ulong)bVar9 * -2 + 1;
      }
      local_1580 = AlternateSeed(local_1588);
      child = local_1580;
    }
    for (dist_parent_nbor._M_param._M_b = 0; dist_parent_nbor._M_param._M_b < lVar4;
        dist_parent_nbor._M_param._M_b = dist_parent_nbor._M_param._M_b + 1) {
      local_1598 = Escape::CGraph::degree(cg,child);
      deg_of_child = local_1598;
      std::uniform_int_distribution<long>::uniform_int_distribution
                ((uniform_int_distribution<long> *)&random_nbor_edge,0,local_1598 + -1);
      local_15a8 = cg->offsets[child];
      local_15a0 = std::uniform_int_distribution<long>::operator()
                             ((uniform_int_distribution<long> *)&random_nbor_edge,local_1548);
      u = local_15a8 + local_15a0;
      parent = parent + 1;
      deg_of_parent = cg->nbors[u];
      local_15b0 = Escape::CGraph::degree(cg,deg_of_parent);
      sC = local_15b0;
      if ((param_4 & 1) == 0) {
        local_1508.u = child;
        local_1508.v = deg_of_parent;
        local_1508.index = u;
        local_1508.degree = deg_of_child;
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
                   &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,&local_1508);
      }
      else {
        if ((local_15b0 < deg_of_child) || ((local_15b0 == deg_of_child && (deg_of_parent < child)))
           ) {
          v = deg_of_parent;
          low_deg = child;
          local_14c8 = local_15b0;
        }
        else {
          v = child;
          low_deg = deg_of_parent;
          local_14c8 = deg_of_child;
        }
        local_14e8.u = v;
        local_14e8.v = low_deg;
        local_14e8.index = u;
        local_14e8.degree = local_14c8;
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::push_back
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
                   &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,&local_14e8);
      }
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_88,u);
      local_15c0 = rVar10._M_mask;
      local_15b8 = rVar10._M_p;
      local_1518._M_p = local_15b8;
      local_1518._M_mask = local_15c0;
      std::_Bit_reference::operator=(&local_1518,true);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_c8,child);
      local_15d0 = rVar10._M_mask;
      local_15c8 = rVar10._M_p;
      local_1528._M_p = local_15c8;
      local_1528._M_mask = local_15d0;
      std::_Bit_reference::operator=(&local_1528,true);
      child = deg_of_parent;
    }
  }
  local_1529 = 0;
  local_1558->no_of_edges = lVar4;
  local_15d8 = &local_1558->edge_list;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (local_15d8,
             (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  local_15e0 = &local_1558->visited_edge_set;
  std::vector<bool,_std::allocator<bool>_>::vector
            (local_15e0,(vector<bool,_std::allocator<bool>_> *)local_88);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1558->visited_vertex_set,(vector<bool,_std::allocator<bool>_> *)local_c8);
  local_1558->no_of_query = parent;
  local_1529 = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_c8)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_88)
  ;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::~vector
            ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)
             &visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  return local_1550;
}

Assistant:

OrderedEdgeCollection GetEdgesByRandomWalk(CGraph *cg, Parameters params, std::mt19937 mt, bool is_degree_orered = false) {
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count; // We are working with only one seed vertex for this project
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and storing the edges found by the random walk
     */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool > visited_edge_set(m,false);
    std::vector<bool > visited_vertex_set(n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm

    /**
     * Local variables
     */
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    for (VertexIdx sC = 0; sC < seed_count; sC++) {

         VertexIdx seed = params.seed_vertices[sC]; // Random seed vertex is already in the params structure.
            parent = seed;
            deg_of_parent = cg->degree(parent); // degree of parent vertex
            if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
                parent = AlternateSeed(cg,mt);

            for (EdgeIdx wL = 0; wL < walk_length; wL++) { // Perform a random walk of length walk_length from the seed vertex and collect the edges
                deg_of_parent = cg->degree(parent); // degree of parent vertex
                std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
                EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                child = cg->nbors[random_nbor_edge]; // child is the next vertex on the random walk
                deg_of_child = cg->degree(child); //degree of child vertex

                /**
                 * Update the edge collection data structure with relevant information about the edge
                 */
                if (is_degree_orered) {
                    VertexIdx u, v, low_deg;
                    if (deg_of_child < deg_of_parent || (deg_of_child == deg_of_parent && child < parent)) {
                        u = child;
                        v = parent;
                        low_deg = deg_of_child;
                    } else {
                        u = parent;
                        v = child;
                        low_deg = deg_of_parent;
                    }
                    edge_list.push_back(OrderedEdge{u, v, random_nbor_edge, low_deg});
                }
                else {
                    edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent});
                }

                /**
                 * Update the book-keeping data structure with the visited edge and vertices
                 */
                visited_edge_set[random_nbor_edge] = true;
                visited_vertex_set[parent] = true;
                parent = child; // The random walk proceeds with the vertex child
            }
        }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set,no_of_query};
    return returnEdgeCollection;
}